

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O1

schar find_roll_to_hit(monst *mtmp)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  schar sVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  
  iVar2 = (int)u.uluck;
  iVar8 = (int)u.moreluck;
  iVar3 = abon();
  iVar4 = find_mac(mtmp);
  if (u.umonnum == u.umonster) {
    sVar9 = (schar)u.ulevel;
  }
  else {
    sVar9 = (youmonst.data)->mlevel;
  }
  cVar11 = (char)iVar3 + (char)iVar4 + u.uhitinc;
  check_caitiff(mtmp);
  if (((urole.malenum == 0x165) && ((mtmp->field_0x62 & 0x40) != 0)) && (-10 < u.ualign.record)) {
    pline("You dishonorably attack the innocent!");
    adjalign(-1);
  }
  uVar5 = *(uint *)&mtmp->field_0x60;
  cVar11 = ((byte)(uVar5 >> 0xf) & 2) + ((byte)(uVar5 >> 0x13) & 2) +
           cVar11 + sVar9 + (char)((iVar8 + iVar2) / 3) + '\x01';
  if ((uVar5 >> 0x13 & 1) != 0) {
    *(uint *)&mtmp->field_0x60 = uVar5 & 0xfff7ffff;
    cVar11 = cVar11 + '\x02';
  }
  if ((mtmp->field_0x62 & 4) == 0) {
    cVar11 = cVar11 + '\x04';
    uVar5 = mt_random();
    if ((uVar5 * -0x33333333 >> 1 | (uint)((uVar5 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
      mtmp->field_0x62 = mtmp->field_0x62 | 4;
      mtmp->mfrozen = '\0';
    }
  }
  if ((mtmp->data->mflags2 & 0x80) != 0) {
    if (u.umonnum == u.umonster) {
      if (urace.malenum != 0x111) goto LAB_002713f4;
    }
    else if (((youmonst.data)->mflags2 & 0x10) == 0) goto LAB_002713f4;
    cVar11 = cVar11 + '\x01';
  }
LAB_002713f4:
  cVar12 = cVar11;
  if ((uwep != (obj *)0x0) && (cVar12 = cVar11 + '\x04', uwep->otyp != 0x216)) {
    cVar12 = cVar11;
  }
  if ((urole.malenum == 0x160) && (u.umonnum == u.umonster)) {
    if (uarm == (obj *)0x0) {
      if (uwep == (obj *)0x0 && uarms == (obj *)0x0) {
        cVar12 = cVar12 + (char)(u.ulevel / 3) + '\x02';
      }
    }
    else {
      pline("Your armor is rather cumbersome...");
      cVar12 = cVar12 - (char)((uint)(urole.spelarmr - (urole.spelarmr >> 0x1f)) >> 1);
    }
  }
  iVar2 = near_capacity();
  cVar11 = (char)iVar2 * '\x02' + -1;
  if (iVar2 == 0) {
    cVar11 = '\0';
  }
  cVar10 = (cVar12 - cVar11) + -3;
  if (u.utrap == 0) {
    cVar10 = cVar12 - cVar11;
  }
  if (u.umonnum == u.umonster) {
    iVar2 = hitval(uwep,mtmp);
    iVar3 = weapon_hit_bonus(uwep);
    cVar10 = cVar10 + (char)iVar3 + (char)iVar2;
  }
  if ((uwep != (obj *)0x0) && ((u._1052_1_ & 1) == 0)) {
    iVar2 = weapon_type(uwep);
    bVar1 = u.weapon_skills[iVar2].skill;
    bVar7 = u.weapon_skills[0x26].skill;
    if ((char)bVar1 <= u.weapon_skills[0x26].skill) {
      bVar7 = bVar1;
    }
    if (u.twoweap == '\0') {
      bVar7 = bVar1;
    }
    if ((bVar7 < 2) && ('\x0f' < cVar10)) {
      uVar5 = mt_random();
      cVar10 = '\x0f';
      if (uVar5 * -0x55555555 < 0x55555556) {
        if ((uwep->oclass == '\x02') ||
           ((uwep->oclass == '\x06' && (objects[uwep->otyp].oc_subtyp != '\0')))) {
          pline("You aren\'t sure you\'re doing this the right way...");
        }
        else {
          pcVar6 = aobjnam(uwep,(char *)0x0);
          pline("You are having a tough time swinging the %s.",pcVar6);
        }
      }
    }
  }
  return cVar10;
}

Assistant:

schar find_roll_to_hit(struct monst *mtmp)
{
	schar tmp;
	int tmp2, wepskill, twowepskill, useskill;

	tmp = 1 + Luck / 3 + abon() + find_mac(mtmp) + u.uhitinc +
		maybe_polyd(youmonst.data->mlevel, u.ulevel);

	check_caitiff(mtmp);

/*	attacking peaceful creatures is bad for the samurai's giri */
	if (Role_if (PM_SAMURAI) && mtmp->mpeaceful &&
	    u.ualign.record > -10) {
	    pline("You dishonorably attack the innocent!");
	    adjalign(-1);
	}

/*	Adjust vs. (and possibly modify) monster state.		*/

	if (mtmp->mstun) tmp += 2;
	if (mtmp->mflee) tmp += 2;

	if (mtmp->msleeping) {
		mtmp->msleeping = 0;
		tmp += 2;
	}
	if (!mtmp->mcanmove) {
		tmp += 4;
		if (!rn2(10)) {
			mtmp->mcanmove = 1;
			mtmp->mfrozen = 0;
		}
	}
	if (is_orc(mtmp->data) && maybe_polyd(is_elf(youmonst.data),
			Race_if (PM_ELF)))
	    tmp++;

	/* Adding iron ball as a weapon skill gives a -4 penalty for
	 * unskilled vs no penalty for non-weapon objects.  Add 4 to
	 * compensate.
	 */
	if (uwep && uwep->otyp == HEAVY_IRON_BALL)
	    tmp += 4;

	if (Role_if(PM_MONK) && !Upolyd) {
	    if (uarm) {
		pline("Your armor is rather cumbersome...");
		tmp -= urole.spelarmr / 2;
	    } else if (!uwep && !uarms) {
		tmp += (u.ulevel / 3) + 2;
	    }
	}

/*	with a lot of luggage, your agility diminishes */
	if ((tmp2 = near_capacity()) != 0) tmp -= (tmp2*2) - 1;
	if (u.utrap) tmp -= 3;
/*	Some monsters have a combination of weapon attacks and non-weapon
 *	attacks.  It is therefore wrong to add hitval to tmp; we must add
 *	it only for the specific attack (in hmonas()).
 */
	if (!Upolyd) {
		tmp += hitval(uwep, mtmp);
		tmp += weapon_hit_bonus(uwep); /* picks up bare-handed bonus */
	}
	/* Let's make UNSKILLED matter, shall we?  If you're UNSKILLED,
	 * you never get more than an 75% chance to hit anything.
	 * (we'll let the fisticuffs guys slide on this, they've got
	 * a hard enough row to hoe anyway)
	 */
	if (uwep && !u.uswallow) {
	    wepskill = P_SKILL(weapon_type(uwep));
	    twowepskill = P_SKILL(P_TWO_WEAPON_COMBAT);
	    /* use the lesser skill of two-weapon or your primary */
	    useskill = (u.twoweap && twowepskill < wepskill) ? twowepskill : wepskill;
	    if ((useskill == P_UNSKILLED || useskill == P_ISRESTRICTED) && tmp > 15) {
		tmp = 15;
		if (!rn2(3)) {
		    /* there's no 'right way' to swing a cockatrice corpse... */
		    if (uwep->oclass != WEAPON_CLASS && !is_weptool(uwep)) {
			pline("You are having a tough time swinging the %s.",
			      aobjnam(uwep, NULL));
		    } else {
			pline("You aren't sure you're doing this the right way...");
		    }
		}
	    }
	}
	return tmp;
}